

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

void __thiscall rengine::Node::Node(Node *this,Type type)

{
  Type type_local;
  Node *this_local;
  
  SignalEmitter::SignalEmitter(&this->super_SignalEmitter);
  (this->super_SignalEmitter)._vptr_SignalEmitter = (_func_int **)&PTR__Node_00164968;
  this->m_parent = (Node *)0x0;
  this->m_child = (Node *)0x0;
  this->m_next = (Node *)0x0;
  this->m_prev = (Node *)0x0;
  *(Type *)&this->field_0x30 = *(Type *)&this->field_0x30 & 0xffffff00 | type & 0xff;
  *(uint *)&this->field_0x30 = *(uint *)&this->field_0x30 & 0xfffffeff;
  *(uint *)&this->field_0x30 = *(uint *)&this->field_0x30 & 0xfffffdff;
  *(uint *)&this->field_0x30 = *(uint *)&this->field_0x30 & 0xfffffbff;
  return;
}

Assistant:

Node(Type type = BasicNodeType)
        : m_parent(0)
        , m_child(0)
        , m_next(0)
        , m_prev(0)
        , m_type(type)
        , m_preprocess(false)
        , m_poolAllocated(false)
        , m_pointerTarget(false)
    {
    }